

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int256_t.hpp
# Opt level: O0

int256_t * __thiscall primesum::int256_t::operator*(int256_t *this,int256_t *other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [11];
  undefined1 auVar18 [11];
  undefined1 auVar19 [11];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 low [16];
  undefined1 low_00 [16];
  undefined1 low_01 [16];
  undefined1 high [16];
  undefined1 high_00 [16];
  undefined1 high_01 [16];
  ulong *in_RDX;
  ulong *in_RSI;
  int256_t *in_RDI;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  byte bVar44;
  uint128_t w;
  uint128_t z;
  uint128_t y;
  uint128_t x;
  uint128_t bh;
  uint128_t bl;
  uint128_t ah;
  uint128_t al;
  unsigned_long max64;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 uVar45;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 uVar46;
  undefined8 in_stack_fffffffffffffdf8;
  int256_t *other_00;
  undefined8 in_stack_fffffffffffffe00;
  int256_t *this_00;
  int256_t local_188;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  int256_t local_148;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  int256_t local_108 [2];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  ulong local_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 local_70;
  ulong local_68;
  undefined8 local_60;
  ulong local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  long local_30;
  unsigned_long local_20;
  ulong *local_18;
  
  local_18 = in_RDX;
  local_20 = prt::numeric_limits<unsigned_long>::max();
  if ((in_RSI[1] == 0 && (ulong)(local_20 < *in_RSI) <= -in_RSI[1]) &&
     (local_18[1] == 0 && (ulong)(local_20 < *local_18) <= -local_18[1])) {
    if (in_RSI[2] != 0 || in_RSI[3] != 0) {
      cVar29 = -((char)in_RSI[2] == -1);
      cVar30 = -(*(char *)((long)in_RSI + 0x11) == -1);
      cVar31 = -(*(char *)((long)in_RSI + 0x12) == -1);
      cVar32 = -(*(char *)((long)in_RSI + 0x13) == -1);
      cVar33 = -(*(char *)((long)in_RSI + 0x14) == -1);
      cVar34 = -(*(char *)((long)in_RSI + 0x15) == -1);
      cVar35 = -(*(char *)((long)in_RSI + 0x16) == -1);
      cVar36 = -(*(char *)((long)in_RSI + 0x17) == -1);
      cVar37 = -((char)in_RSI[3] == -1);
      cVar38 = -(*(char *)((long)in_RSI + 0x19) == -1);
      cVar39 = -(*(char *)((long)in_RSI + 0x1a) == -1);
      cVar40 = -(*(char *)((long)in_RSI + 0x1b) == -1);
      cVar41 = -(*(char *)((long)in_RSI + 0x1c) == -1);
      cVar42 = -(*(char *)((long)in_RSI + 0x1d) == -1);
      cVar43 = -(*(char *)((long)in_RSI + 0x1e) == -1);
      bVar44 = -(*(char *)((long)in_RSI + 0x1f) == -1);
      auVar11[1] = cVar30;
      auVar11[0] = cVar29;
      auVar11[2] = cVar31;
      auVar11[3] = cVar32;
      auVar11[4] = cVar33;
      auVar11[5] = cVar34;
      auVar11[6] = cVar35;
      auVar11[7] = cVar36;
      auVar11[8] = cVar37;
      auVar11[9] = cVar38;
      auVar11[10] = cVar39;
      auVar11[0xb] = cVar40;
      auVar11[0xc] = cVar41;
      auVar11[0xd] = cVar42;
      auVar11[0xe] = cVar43;
      auVar11[0xf] = bVar44;
      auVar12[1] = cVar30;
      auVar12[0] = cVar29;
      auVar12[2] = cVar31;
      auVar12[3] = cVar32;
      auVar12[4] = cVar33;
      auVar12[5] = cVar34;
      auVar12[6] = cVar35;
      auVar12[7] = cVar36;
      auVar12[8] = cVar37;
      auVar12[9] = cVar38;
      auVar12[10] = cVar39;
      auVar12[0xb] = cVar40;
      auVar12[0xc] = cVar41;
      auVar12[0xd] = cVar42;
      auVar12[0xe] = cVar43;
      auVar12[0xf] = bVar44;
      auVar26[1] = cVar32;
      auVar26[0] = cVar31;
      auVar26[2] = cVar33;
      auVar26[3] = cVar34;
      auVar26[4] = cVar35;
      auVar26[5] = cVar36;
      auVar26[6] = cVar37;
      auVar26[7] = cVar38;
      auVar26[8] = cVar39;
      auVar26[9] = cVar40;
      auVar26[10] = cVar41;
      auVar26[0xb] = cVar42;
      auVar26[0xc] = cVar43;
      auVar26[0xd] = bVar44;
      auVar23[1] = cVar33;
      auVar23[0] = cVar32;
      auVar23[2] = cVar34;
      auVar23[3] = cVar35;
      auVar23[4] = cVar36;
      auVar23[5] = cVar37;
      auVar23[6] = cVar38;
      auVar23[7] = cVar39;
      auVar23[8] = cVar40;
      auVar23[9] = cVar41;
      auVar23[10] = cVar42;
      auVar23[0xb] = cVar43;
      auVar23[0xc] = bVar44;
      auVar20[1] = cVar34;
      auVar20[0] = cVar33;
      auVar20[2] = cVar35;
      auVar20[3] = cVar36;
      auVar20[4] = cVar37;
      auVar20[5] = cVar38;
      auVar20[6] = cVar39;
      auVar20[7] = cVar40;
      auVar20[8] = cVar41;
      auVar20[9] = cVar42;
      auVar20[10] = cVar43;
      auVar20[0xb] = bVar44;
      auVar17[1] = cVar35;
      auVar17[0] = cVar34;
      auVar17[2] = cVar36;
      auVar17[3] = cVar37;
      auVar17[4] = cVar38;
      auVar17[5] = cVar39;
      auVar17[6] = cVar40;
      auVar17[7] = cVar41;
      auVar17[8] = cVar42;
      auVar17[9] = cVar43;
      auVar17[10] = bVar44;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB141(auVar26 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar23 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar20 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar17 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar44,CONCAT18(cVar43,CONCAT17(cVar42,CONCAT16(cVar41,
                                                  CONCAT15(cVar40,CONCAT14(cVar39,CONCAT13(cVar38,
                                                  CONCAT12(cVar37,CONCAT11(cVar36,cVar35))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar44,CONCAT17(cVar43,CONCAT16(cVar42,CONCAT15(cVar41,
                                                  CONCAT14(cVar40,CONCAT13(cVar39,CONCAT12(cVar38,
                                                  CONCAT11(cVar37,cVar36)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar44 >> 7) << 0xf) != 0xffff) goto LAB_00118012;
    }
    if (local_18[2] != 0 || local_18[3] != 0) {
      cVar29 = -((char)local_18[2] == -1);
      cVar30 = -(*(char *)((long)local_18 + 0x11) == -1);
      cVar31 = -(*(char *)((long)local_18 + 0x12) == -1);
      cVar32 = -(*(char *)((long)local_18 + 0x13) == -1);
      cVar33 = -(*(char *)((long)local_18 + 0x14) == -1);
      cVar34 = -(*(char *)((long)local_18 + 0x15) == -1);
      cVar35 = -(*(char *)((long)local_18 + 0x16) == -1);
      cVar36 = -(*(char *)((long)local_18 + 0x17) == -1);
      cVar37 = -((char)local_18[3] == -1);
      cVar38 = -(*(char *)((long)local_18 + 0x19) == -1);
      cVar39 = -(*(char *)((long)local_18 + 0x1a) == -1);
      cVar40 = -(*(char *)((long)local_18 + 0x1b) == -1);
      cVar41 = -(*(char *)((long)local_18 + 0x1c) == -1);
      cVar42 = -(*(char *)((long)local_18 + 0x1d) == -1);
      cVar43 = -(*(char *)((long)local_18 + 0x1e) == -1);
      bVar44 = -(*(char *)((long)local_18 + 0x1f) == -1);
      auVar13[1] = cVar30;
      auVar13[0] = cVar29;
      auVar13[2] = cVar31;
      auVar13[3] = cVar32;
      auVar13[4] = cVar33;
      auVar13[5] = cVar34;
      auVar13[6] = cVar35;
      auVar13[7] = cVar36;
      auVar13[8] = cVar37;
      auVar13[9] = cVar38;
      auVar13[10] = cVar39;
      auVar13[0xb] = cVar40;
      auVar13[0xc] = cVar41;
      auVar13[0xd] = cVar42;
      auVar13[0xe] = cVar43;
      auVar13[0xf] = bVar44;
      auVar14[1] = cVar30;
      auVar14[0] = cVar29;
      auVar14[2] = cVar31;
      auVar14[3] = cVar32;
      auVar14[4] = cVar33;
      auVar14[5] = cVar34;
      auVar14[6] = cVar35;
      auVar14[7] = cVar36;
      auVar14[8] = cVar37;
      auVar14[9] = cVar38;
      auVar14[10] = cVar39;
      auVar14[0xb] = cVar40;
      auVar14[0xc] = cVar41;
      auVar14[0xd] = cVar42;
      auVar14[0xe] = cVar43;
      auVar14[0xf] = bVar44;
      auVar27[1] = cVar32;
      auVar27[0] = cVar31;
      auVar27[2] = cVar33;
      auVar27[3] = cVar34;
      auVar27[4] = cVar35;
      auVar27[5] = cVar36;
      auVar27[6] = cVar37;
      auVar27[7] = cVar38;
      auVar27[8] = cVar39;
      auVar27[9] = cVar40;
      auVar27[10] = cVar41;
      auVar27[0xb] = cVar42;
      auVar27[0xc] = cVar43;
      auVar27[0xd] = bVar44;
      auVar24[1] = cVar33;
      auVar24[0] = cVar32;
      auVar24[2] = cVar34;
      auVar24[3] = cVar35;
      auVar24[4] = cVar36;
      auVar24[5] = cVar37;
      auVar24[6] = cVar38;
      auVar24[7] = cVar39;
      auVar24[8] = cVar40;
      auVar24[9] = cVar41;
      auVar24[10] = cVar42;
      auVar24[0xb] = cVar43;
      auVar24[0xc] = bVar44;
      auVar21[1] = cVar34;
      auVar21[0] = cVar33;
      auVar21[2] = cVar35;
      auVar21[3] = cVar36;
      auVar21[4] = cVar37;
      auVar21[5] = cVar38;
      auVar21[6] = cVar39;
      auVar21[7] = cVar40;
      auVar21[8] = cVar41;
      auVar21[9] = cVar42;
      auVar21[10] = cVar43;
      auVar21[0xb] = bVar44;
      auVar18[1] = cVar35;
      auVar18[0] = cVar34;
      auVar18[2] = cVar36;
      auVar18[3] = cVar37;
      auVar18[4] = cVar38;
      auVar18[5] = cVar39;
      auVar18[6] = cVar40;
      auVar18[7] = cVar41;
      auVar18[8] = cVar42;
      auVar18[9] = cVar43;
      auVar18[10] = bVar44;
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB141(auVar27 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar24 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar21 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar18 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar44,CONCAT18(cVar43,CONCAT17(cVar42,CONCAT16(cVar41,
                                                  CONCAT15(cVar40,CONCAT14(cVar39,CONCAT13(cVar38,
                                                  CONCAT12(cVar37,CONCAT11(cVar36,cVar35))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar44,CONCAT17(cVar43,CONCAT16(cVar42,CONCAT15(cVar41,
                                                  CONCAT14(cVar40,CONCAT13(cVar39,CONCAT12(cVar38,
                                                  CONCAT11(cVar37,cVar36)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar44 >> 7) << 0xf) != 0xffff) goto LAB_00118012;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *in_RSI;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *local_18;
    local_38 = SUB168(auVar1 * auVar6,0);
    local_30 = SUB168(auVar1 * auVar6,8) + *in_RSI * local_18[1] + in_RSI[1] * *local_18;
    cVar29 = -((char)in_RSI[2] == (char)local_18[2]);
    cVar30 = -(*(char *)((long)in_RSI + 0x11) == *(char *)((long)local_18 + 0x11));
    cVar31 = -(*(char *)((long)in_RSI + 0x12) == *(char *)((long)local_18 + 0x12));
    cVar32 = -(*(char *)((long)in_RSI + 0x13) == *(char *)((long)local_18 + 0x13));
    cVar33 = -(*(char *)((long)in_RSI + 0x14) == *(char *)((long)local_18 + 0x14));
    cVar34 = -(*(char *)((long)in_RSI + 0x15) == *(char *)((long)local_18 + 0x15));
    cVar35 = -(*(char *)((long)in_RSI + 0x16) == *(char *)((long)local_18 + 0x16));
    cVar36 = -(*(char *)((long)in_RSI + 0x17) == *(char *)((long)local_18 + 0x17));
    cVar37 = -((char)in_RSI[3] == (char)local_18[3]);
    cVar38 = -(*(char *)((long)in_RSI + 0x19) == *(char *)((long)local_18 + 0x19));
    cVar39 = -(*(char *)((long)in_RSI + 0x1a) == *(char *)((long)local_18 + 0x1a));
    cVar40 = -(*(char *)((long)in_RSI + 0x1b) == *(char *)((long)local_18 + 0x1b));
    cVar41 = -(*(char *)((long)in_RSI + 0x1c) == *(char *)((long)local_18 + 0x1c));
    cVar42 = -(*(char *)((long)in_RSI + 0x1d) == *(char *)((long)local_18 + 0x1d));
    cVar43 = -(*(char *)((long)in_RSI + 0x1e) == *(char *)((long)local_18 + 0x1e));
    bVar44 = -(*(char *)((long)in_RSI + 0x1f) == *(char *)((long)local_18 + 0x1f));
    auVar15[1] = cVar30;
    auVar15[0] = cVar29;
    auVar15[2] = cVar31;
    auVar15[3] = cVar32;
    auVar15[4] = cVar33;
    auVar15[5] = cVar34;
    auVar15[6] = cVar35;
    auVar15[7] = cVar36;
    auVar15[8] = cVar37;
    auVar15[9] = cVar38;
    auVar15[10] = cVar39;
    auVar15[0xb] = cVar40;
    auVar15[0xc] = cVar41;
    auVar15[0xd] = cVar42;
    auVar15[0xe] = cVar43;
    auVar15[0xf] = bVar44;
    auVar16[1] = cVar30;
    auVar16[0] = cVar29;
    auVar16[2] = cVar31;
    auVar16[3] = cVar32;
    auVar16[4] = cVar33;
    auVar16[5] = cVar34;
    auVar16[6] = cVar35;
    auVar16[7] = cVar36;
    auVar16[8] = cVar37;
    auVar16[9] = cVar38;
    auVar16[10] = cVar39;
    auVar16[0xb] = cVar40;
    auVar16[0xc] = cVar41;
    auVar16[0xd] = cVar42;
    auVar16[0xe] = cVar43;
    auVar16[0xf] = bVar44;
    auVar28[1] = cVar32;
    auVar28[0] = cVar31;
    auVar28[2] = cVar33;
    auVar28[3] = cVar34;
    auVar28[4] = cVar35;
    auVar28[5] = cVar36;
    auVar28[6] = cVar37;
    auVar28[7] = cVar38;
    auVar28[8] = cVar39;
    auVar28[9] = cVar40;
    auVar28[10] = cVar41;
    auVar28[0xb] = cVar42;
    auVar28[0xc] = cVar43;
    auVar28[0xd] = bVar44;
    auVar25[1] = cVar33;
    auVar25[0] = cVar32;
    auVar25[2] = cVar34;
    auVar25[3] = cVar35;
    auVar25[4] = cVar36;
    auVar25[5] = cVar37;
    auVar25[6] = cVar38;
    auVar25[7] = cVar39;
    auVar25[8] = cVar40;
    auVar25[9] = cVar41;
    auVar25[10] = cVar42;
    auVar25[0xb] = cVar43;
    auVar25[0xc] = bVar44;
    auVar22[1] = cVar34;
    auVar22[0] = cVar33;
    auVar22[2] = cVar35;
    auVar22[3] = cVar36;
    auVar22[4] = cVar37;
    auVar22[5] = cVar38;
    auVar22[6] = cVar39;
    auVar22[7] = cVar40;
    auVar22[8] = cVar41;
    auVar22[9] = cVar42;
    auVar22[10] = cVar43;
    auVar22[0xb] = bVar44;
    auVar19[1] = cVar35;
    auVar19[0] = cVar34;
    auVar19[2] = cVar36;
    auVar19[3] = cVar37;
    auVar19[4] = cVar38;
    auVar19[5] = cVar39;
    auVar19[6] = cVar40;
    auVar19[7] = cVar41;
    auVar19[8] = cVar42;
    auVar19[9] = cVar43;
    auVar19[10] = bVar44;
    local_48 = -(ulong)((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB141(auVar28 >> 7,0) & 1) << 2 |
                                 (ushort)(SUB131(auVar25 >> 7,0) & 1) << 3 |
                                 (ushort)(SUB121(auVar22 >> 7,0) & 1) << 4 |
                                 (ushort)(SUB111(auVar19 >> 7,0) & 1) << 5 |
                                 (ushort)((byte)(CONCAT19(bVar44,CONCAT18(cVar43,CONCAT17(cVar42,
                                                  CONCAT16(cVar41,CONCAT15(cVar40,CONCAT14(cVar39,
                                                  CONCAT13(cVar38,CONCAT12(cVar37,CONCAT11(cVar36,
                                                  cVar35))))))))) >> 7) & 1) << 6 |
                                 (ushort)((byte)(CONCAT18(bVar44,CONCAT17(cVar43,CONCAT16(cVar42,
                                                  CONCAT15(cVar41,CONCAT14(cVar40,CONCAT13(cVar39,
                                                  CONCAT12(cVar38,CONCAT11(cVar37,cVar36)))))))) >>
                                                7) & 1) << 7 | (ushort)(bVar44 >> 7) << 0xf) !=
                       0xffff);
    low._8_8_ = in_stack_fffffffffffffdf0;
    low._0_8_ = in_stack_fffffffffffffde8;
    high._8_8_ = in_stack_fffffffffffffe00;
    high._0_8_ = in_stack_fffffffffffffdf8;
    local_40 = local_48;
    int256_t(in_RDI,(uint128_t)low,(uint128_t)high);
  }
  else {
LAB_00118012:
    local_58 = *in_RSI & local_20;
    local_50 = 0;
    local_68 = in_RSI[1];
    local_60 = 0;
    local_78 = *local_18 & local_20;
    local_70 = 0;
    local_88 = local_18[1];
    local_80 = 0;
    uVar45 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_58;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_78;
    local_98 = auVar2 * auVar7;
    uVar46 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_58;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_88;
    local_128 = SUB168(auVar3 * auVar8,8);
    local_110 = SUB168(auVar3 * auVar8,0);
    other_00 = (int256_t *)0x0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_68;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_78;
    local_b8 = auVar4 * auVar9;
    this_00 = (int256_t *)0x0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_68;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_88;
    local_c8 = auVar5 * auVar10;
    local_118 = 0;
    local_120 = 0;
    local_a8 = local_110;
    local_a0 = local_128;
    int256_t(local_108,(uint128_t)ZEXT816(0),(uint128_t)ZEXT816(0));
    local_150 = local_b8._0_8_;
    local_158 = 0;
    local_168 = local_b8._8_8_;
    local_160 = 0;
    low_00._8_8_ = uVar46;
    low_00._0_8_ = uVar45;
    high_00._8_8_ = this_00;
    high_00._0_8_ = other_00;
    int256_t(&local_148,(uint128_t)low_00,(uint128_t)high_00);
    operator+(this_00,other_00);
    low_01._8_8_ = uVar46;
    low_01._0_8_ = uVar45;
    high_01._8_8_ = this_00;
    high_01._0_8_ = other_00;
    int256_t(&local_188,(uint128_t)low_01,(uint128_t)high_01);
    operator+(this_00,other_00);
  }
  return in_RDI;
}

Assistant:

int256_t operator*(const int256_t& other) const
    {
        auto max64 = prt::numeric_limits<std::uint64_t>::max();

        if (low <= max64 &&
            other.low <= max64 &&
            ((high == 0 || ~high == 0) &&
             (other.high == 0 || ~other.high == 0)))
        {
          return int256_t(low * other.low,
                          (high == other.high) ? 0 : -1);
        }
        else
        {
            auto al = low & max64;
            auto ah = low >> 64;
            auto bl = other.low & max64;
            auto bh = other.low >> 64;

            auto x = al * bl;
            auto y = al * bh;
            auto z = ah * bl;
            auto w = ah * bh;

            return int256_t(y << 64, y >> 64) +
                   int256_t(z << 64, z >> 64) +
                   int256_t(x, w + low * other.high + high * other.low);
        }
    }